

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O3

int __thiscall ReadData::ReadHead(ReadData *this,FILE *file,uchar *buff)

{
  ushort uVar1;
  int iVar2;
  size_t sVar3;
  uchar HeadFlag [3];
  char local_2b;
  char local_2a;
  char local_29;
  
  if (file == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"open error",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    iVar2 = 7;
  }
  else {
    iVar2 = feof((FILE *)file);
    if (iVar2 == 0) {
      do {
        sVar3 = fread(&local_29,1,1,(FILE *)file);
        if (sVar3 == 0) {
          return 2;
        }
        if (local_29 == '\x12' && (local_2a == 'D' && local_2b == -0x56)) {
          sVar3 = fread(buff,0x19,1,(FILE *)file);
          if (sVar3 == 0) {
            return 2;
          }
          uVar1 = *(ushort *)(buff + 1);
          (this->Head).MessageID = (uint)uVar1;
          (this->Head).MessageLength = (uint)*(ushort *)(buff + 5);
          (this->Head).TimeStatus = (uint)buff[10];
          if (uVar1 == 0x2b) {
            (this->Head).GPST.Week = (uint)*(ushort *)(buff + 0xb);
            (this->Head).GPST.SOW = (double)*(int *)(buff + 0xd) / 1000.0;
          }
          (this->Head).HealthFlag = *(uint *)(buff + 0x11) & 1;
          break;
        }
        local_2b = local_2a;
        local_2a = local_29;
        iVar2 = feof((FILE *)file);
      } while (iVar2 == 0);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ReadData::ReadHead(FILE* file, unsigned char* buff)
{
    if(file == NULL)
    {
        cout << "open error" << endl;
        return OPEN_ERROR;
    }

    unsigned char HeadFlag[3];
    while(!feof(file))
    {
        if(!fread(&HeadFlag[2], 1, 1, file))
            return FILE_OR_BUFF_END;

        if(HeadFlag[0] != 0xaa || HeadFlag[1] != 0x44 || HeadFlag[2] != 0x12)
        {
            HeadFlag[0] = HeadFlag[1];
            HeadFlag[1] = HeadFlag[2];
            continue;
        }
        if(!fread(buff, 25, 1, file))
            return FILE_OR_BUFF_END;
        int HeadLength = U2I((buff + 3), 1);
        try
        {
            this->Head.MessageID = U2I((buff + 1), 2);
            this->Head.MessageLength = U2I((buff + 5), 2);
            this->Head.TimeStatus = U2I((buff + 10), 1);
            if(this->Head.MessageID == 43)
            {
                this->Head.GPST.Week = U2I((buff + 11), 2);
                this->Head.GPST.SOW = U2I((buff + 13), 4) / 1000.0;
            }
            this->Head.HealthFlag = (U2I((buff + 17), 4) & 1);
        }
        catch(...)
        {
            cout << "error happened when reading head" << endl;
            return UNKNOWN_ERROR;
        }
        break;
    }
    
    return 0;
}